

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApproverTests.cpp
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_dae80::IdenticalFilenamesNamer::getApprovedFile
          (string *__return_storage_ptr__,IdenticalFilenamesNamer *this,string *extensionWithDot)

{
  ApprovalTestNamer namer;
  ApprovalTestNamer local_40;
  string local_38;
  
  local_40.super_ApprovalNamer._vptr_ApprovalNamer = (ApprovalNamer)&PTR__ApprovalNamer_001bc5a0;
  std::__cxx11::string::string((string *)&local_38,(string *)extensionWithDot);
  ApprovalTests::ApprovalTestNamer::getApprovedFile(__return_storage_ptr__,&local_40,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

const override
        {
            ApprovalTestNamer namer;
            return namer.getApprovedFile(extensionWithDot);
        }